

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O0

int uv_signal_init(uv_loop_t *loop,uv_signal_t *handle)

{
  int err;
  uv_signal_t *handle_local;
  uv_loop_t *loop_local;
  
  loop_local._4_4_ = uv__signal_loop_once_init(loop);
  if (loop_local._4_4_ == 0) {
    handle->loop = loop;
    handle->type = UV_SIGNAL;
    handle->flags = 0x2000;
    handle->handle_queue[0] = loop->handle_queue;
    handle->handle_queue[1] = loop->handle_queue[1];
    *(void ***)handle->handle_queue[1] = handle->handle_queue;
    loop->handle_queue[1] = handle->handle_queue;
    handle->next_closing = (uv_handle_t *)0x0;
    handle->signum = 0;
    handle->caught_signals = 0;
    handle->dispatched_signals = 0;
    loop_local._4_4_ = 0;
  }
  return loop_local._4_4_;
}

Assistant:

int uv_signal_init(uv_loop_t* loop, uv_signal_t* handle) {
  int err;

  err = uv__signal_loop_once_init(loop);
  if (err)
    return err;

  uv__handle_init(loop, (uv_handle_t*) handle, UV_SIGNAL);
  handle->signum = 0;
  handle->caught_signals = 0;
  handle->dispatched_signals = 0;

  return 0;
}